

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

void unres_data_diff_rem(unres_data *unres,uint idx)

{
  lyd_node **pplVar1;
  lyd_difflist *plVar2;
  uint uVar3;
  
  plVar2 = unres->diff;
  if (plVar2->type[idx] == LYD_DIFF_DELETED) {
    lyd_free_withsiblings(plVar2->first[idx]);
    free(unres->diff->second[idx]);
    plVar2 = unres->diff;
  }
  uVar3 = unres->diff_idx;
  if (idx < uVar3 - 1) {
    plVar2->type[idx] = plVar2->type[uVar3 - 1];
    uVar3 = unres->diff_idx;
    plVar2->first[idx] = plVar2->first[uVar3 - 1];
    pplVar1 = unres->diff->second;
    pplVar1[idx] = pplVar1[uVar3 - 1];
    plVar2 = unres->diff;
  }
  if (plVar2->type[uVar3] == LYD_DIFF_END) {
    plVar2->type[uVar3 - 1] = LYD_DIFF_END;
    unres->diff_idx = unres->diff_idx - 1;
    return;
  }
  __assert_fail("unres->diff->type[unres->diff_idx] == LYD_DIFF_END",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                ,0x1b2f,"void unres_data_diff_rem(struct unres_data *, unsigned int)");
}

Assistant:

void
unres_data_diff_rem(struct unres_data *unres, unsigned int idx)
{
    if (unres->diff->type[idx] == LYD_DIFF_DELETED) {
        lyd_free_withsiblings(unres->diff->first[idx]);
        free(unres->diff->second[idx]);
    }

    /* replace by last real value */
    if (idx < unres->diff_idx - 1) {
        unres->diff->type[idx] = unres->diff->type[unres->diff_idx - 1];
        unres->diff->first[idx] = unres->diff->first[unres->diff_idx - 1];
        unres->diff->second[idx] = unres->diff->second[unres->diff_idx - 1];
    }

    /* move the end */
    assert(unres->diff->type[unres->diff_idx] == LYD_DIFF_END);
    unres->diff->type[unres->diff_idx - 1] = unres->diff->type[unres->diff_idx];
    --unres->diff_idx;
}